

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureStateQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gls::TextureStateQueryTests::anon_unknown_1::IsTextureCase::init
          (IsTextureCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int extraout_EAX;
  ContextInfo *pCVar2;
  ContextType local_6c;
  RequiredExtensions local_68;
  ContextType local_50 [4];
  undefined1 local_40 [8];
  RequiredExtensions extensions;
  undefined1 local_20 [8];
  UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> ctxInfo;
  IsTextureCase *this_local;
  
  ctxInfo.super_UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>.m_data._8_8_ =
       this;
  pCVar2 = glu::ContextInfo::create(this->m_renderCtx);
  de::DefaultDeleter<glu::ContextInfo>::DefaultDeleter
            ((DefaultDeleter<glu::ContextInfo> *)
             ((long)&extensions.m_extensions.
                     super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  de::details::UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::UniquePtr
            ((UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)local_20,pCVar2);
  RequiredExtensions::RequiredExtensions((RequiredExtensions *)local_40);
  local_50[0].super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
  bVar1 = isCoreTextureTarget(local_50,this->m_target);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    local_6c.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
    getTextureTargetExtension(&local_68,&local_6c,this->m_target);
    RequiredExtensions::add((RequiredExtensions *)local_40,&local_68);
    RequiredExtensions::~RequiredExtensions(&local_68);
  }
  pCVar2 = de::details::UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::
           operator*((UniqueBase<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)local_20
                    );
  RequiredExtensions::check((RequiredExtensions *)local_40,pCVar2);
  RequiredExtensions::~RequiredExtensions((RequiredExtensions *)local_40);
  de::details::UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_>::~UniquePtr
            ((UniquePtr<glu::ContextInfo,_de::DefaultDeleter<glu::ContextInfo>_> *)local_20);
  return extraout_EAX;
}

Assistant:

void IsTextureCase::init (void)
{
	const de::UniquePtr<glu::ContextInfo>	ctxInfo		(glu::ContextInfo::create(m_renderCtx));
	RequiredExtensions						extensions;

	// target
	if (!isCoreTextureTarget(m_renderCtx.getType(), m_target))
		extensions.add(getTextureTargetExtension(m_renderCtx.getType(), m_target));

	extensions.check(*ctxInfo);
}